

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmReturn(LlvmCompilationContext *ctx,ExprReturn *node)

{
  ExpressionContext *pEVar1;
  TypeBase *pTVar2;
  LLVMValueRef value;
  TypeBase *targetType;
  TypeBase *pTVar3;
  long lVar4;
  TypeBase *pTVar5;
  TypeBase *pTVar6;
  
  value = CompileLlvm(ctx,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  targetType = node->value->type;
  pEVar1 = ctx->ctx;
  pTVar3 = pEVar1->typeVoid;
  if (targetType == pTVar3) {
    pTVar3 = targetType;
    if (ctx->currentFunctionGlobal != false) {
      __assert_fail("!ctx.currentFunctionGlobal",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x5b1,"LLVMValueRef CompileLlvmReturn(LlvmCompilationContext &, ExprReturn *)")
      ;
    }
    goto LAB_0025f509;
  }
  pTVar2 = pEVar1->typeBool;
  if (ctx->currentFunctionGlobal == false) {
    lVar4 = 0x89d8;
    if (((pTVar2 == targetType) || (pEVar1->typeChar == targetType)) ||
       (pEVar1->typeShort == targetType)) {
LAB_0025f49e:
      pTVar3 = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar4 + -0x30);
    }
    else {
      pTVar3 = targetType;
      if (pEVar1->typeFloat == targetType) {
        lVar4 = 0x89f0;
        goto LAB_0025f49e;
      }
    }
    ConvertToDataType(ctx,value,pTVar3,targetType);
    pTVar3 = ctx->ctx->typeVoid;
    goto LAB_0025f509;
  }
  lVar4 = 0x89d8;
  if (((pTVar2 == targetType) || (pEVar1->typeChar == targetType)) ||
     (pEVar1->typeShort == targetType)) {
LAB_0025f3de:
    pTVar6 = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar4 + -0x30);
  }
  else {
    pTVar6 = targetType;
    if (pEVar1->typeFloat == targetType) {
      lVar4 = 0x89f0;
      goto LAB_0025f3de;
    }
  }
  pTVar5 = pEVar1->typeInt;
  if ((pTVar6 == pTVar5) || ((targetType != (TypeBase *)0x0 && (targetType->typeID == 0x19))))
  goto LAB_0025f509;
  if ((pTVar2 == targetType) || (pEVar1->typeChar == targetType)) {
    lVar4 = 0x89d8;
    if (pTVar5 == pEVar1->typeLong) goto LAB_0025f509;
LAB_0025f4fc:
    targetType = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar4 + -0x30);
  }
  else {
    if (pEVar1->typeShort == targetType) {
LAB_0025f4d0:
      if (pTVar5 == pEVar1->typeLong) goto LAB_0025f509;
      if (pEVar1->typeChar != targetType) goto LAB_0025f4de;
LAB_0025f4f7:
      lVar4 = 0x89d8;
      goto LAB_0025f4fc;
    }
    if (pEVar1->typeFloat == targetType) {
      pTVar5 = pEVar1->typeDouble;
      goto LAB_0025f4d0;
    }
    if (targetType == pEVar1->typeLong) goto LAB_0025f509;
LAB_0025f4de:
    if (pEVar1->typeShort == targetType) goto LAB_0025f4f7;
    if (pEVar1->typeFloat == targetType) {
      lVar4 = 0x89f0;
      goto LAB_0025f4fc;
    }
  }
  if (targetType != pEVar1->typeDouble) {
    __assert_fail("!\"unknown global return type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x5d3,"LLVMValueRef CompileLlvmReturn(LlvmCompilationContext &, ExprReturn *)");
  }
LAB_0025f509:
  if ((node->super_ExprBase).type != pTVar3) {
    __assert_fail("node->type == ctx.ctx.typeVoid",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x27b,
                  "LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)");
  }
  return (LLVMValueRef)0x0;
}

Assistant:

LLVMValueRef CompileLlvmReturn(LlvmCompilationContext &ctx, ExprReturn *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	if(node->coroutineStateUpdate)
		CompileLlvm(ctx, node->coroutineStateUpdate);

	if(node->closures)
		CompileLlvm(ctx, node->closures);

	if(node->value->type == ctx.ctx.typeVoid)
	{
		assert(!ctx.currentFunctionGlobal);

		LLVMBuildRetVoid(ctx.builder);
	}
	else
	{
		if(ctx.currentFunctionGlobal)
		{
			if(GetStackType(ctx, node->value->type) == ctx.ctx.typeInt || isType<TypeEnum>(node->value->type))
			{
				LLVMValueRef arguments[] = { value };

				LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmReturnInt"), arguments, 1, "");

				LLVMBuildRetVoid(ctx.builder);
			}
			else if(GetStackType(ctx, node->value->type) == ctx.ctx.typeLong)
			{
				LLVMValueRef arguments[] = { value };

				LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmReturnLong"), arguments, 1, "");

				LLVMBuildRetVoid(ctx.builder);
			}
			else if(GetStackType(ctx, node->value->type) == ctx.ctx.typeDouble)
			{
				LLVMValueRef arguments[] = { value };

				LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmReturnDouble"), arguments, 1, "");

				LLVMBuildRetVoid(ctx.builder);
			}
			else
			{
				assert(!"unknown global return type");
			}
		}
		else
		{
			value = ConvertToDataType(ctx, value, GetStackType(ctx, node->value->type), node->value->type);

			if(IsStructReturnType(ctx.currentFunctionSource->type->returnType))
			{
				LLVMBuildStore(ctx.builder, value, LLVMGetParam(ctx.currentFunction, 0));

				LLVMBuildRetVoid(ctx.builder);
			}
			else
			{
				LLVMBuildRet(ctx.builder, value);
			}
		}
	}

	LLVMBasicBlockRef afterReturn = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "after_return");

	LLVMPositionBuilderAtEnd(ctx.builder, afterReturn);

	return CheckType(ctx, node, NULL);
}